

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractTextDocumentLayout::Selection>::
emplace<QAbstractTextDocumentLayout::Selection_const&>
          (QMovableArrayOps<QAbstractTextDocumentLayout::Selection> *this,qsizetype i,
          Selection *args)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  qsizetype qVar4;
  Inserter *in_RDX;
  Selection *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  Selection tmp;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar7;
  Inserter *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::needsDetach
                    ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)in_RDI);
  if (!(bool)uVar2) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar4 = QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::freeSpaceAtEnd
                          ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar4 != 0)) {
      QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::end
                ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)in_RDI);
      QAbstractTextDocumentLayout::Selection::Selection
                ((Selection *)in_RDI,
                 (Selection *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_RDI->displaceTo = (Selection *)&in_RDI->displaceTo->field_0x1;
      goto LAB_00730422;
    }
    if ((in_RSI == (Selection *)0x0) &&
       (qVar4 = QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::freeSpaceAtBegin
                          ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)
                           CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar4 != 0)) {
      QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::begin
                ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x7302e4);
      QAbstractTextDocumentLayout::Selection::Selection
                ((Selection *)in_RDI,
                 (Selection *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (Selection *)&in_RDI->displaceTo->field_0x1;
      goto LAB_00730422;
    }
  }
  QAbstractTextDocumentLayout::Selection::Selection
            ((Selection *)in_RDI,
             (Selection *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar5 = in_RDI->displaceTo != (Selection *)0x0;
  uVar6 = bVar5 && in_RSI == (Selection *)0x0;
  uVar3 = (uint)(bVar5 && in_RSI == (Selection *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::detachAndGrow
            ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (Selection **)CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff9c,uVar3)))
             ,(QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)
                              CONCAT17(uVar2,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffff9c,uVar3
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff88));
    Inserter::insertOne(in_RDI,(Selection *)CONCAT17(uVar6,in_stack_ffffffffffffff88));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::begin
              ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x7303b6);
    QAbstractTextDocumentLayout::Selection::Selection
              ((Selection *)in_RDI,(Selection *)CONCAT17(uVar6,in_stack_ffffffffffffff88));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (Selection *)&in_RDI->displaceTo->field_0x1;
  }
  QAbstractTextDocumentLayout::Selection::~Selection((Selection *)in_RDI);
LAB_00730422:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }